

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

uint64 __thiscall google::protobuf::internal::ArenaImpl::FreeBlocks(ArenaImpl *this)

{
  SerialArena *pSVar1;
  uint64 uVar2;
  __pointer_type serial;
  uint64 uVar3;
  
  uVar3 = 0;
  serial = (this->threads_)._M_b._M_p;
  while (serial != (SerialArena *)0x0) {
    pSVar1 = serial->next_;
    uVar2 = SerialArena::Free(serial,this->initial_block_,(this->options_).block_dealloc);
    uVar3 = uVar3 + uVar2;
    serial = pSVar1;
  }
  return uVar3;
}

Assistant:

uint64 ArenaImpl::FreeBlocks() {
  uint64 space_allocated = 0;
  // By omitting an Acquire barrier we ensure that any user code that doesn't
  // properly synchronize Reset() or the destructor will throw a TSAN warning.
  SerialArena* serial = threads_.load(std::memory_order_relaxed);

  while (serial) {
    // This is inside a block we are freeing, so we need to read it now.
    SerialArena* next = serial->next();
    space_allocated += ArenaImpl::SerialArena::Free(serial, initial_block_,
                                                    options_.block_dealloc);
    // serial is dead now.
    serial = next;
  }

  return space_allocated;
}